

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gflags.cc
# Opt level: O2

bool __thiscall
gflags::FilenameFlagnameCmp::operator()
          (FilenameFlagnameCmp *this,CommandLineFlagInfo *a,CommandLineFlagInfo *b)

{
  int iVar1;
  
  iVar1 = strcmp((a->filename)._M_dataplus._M_p,(b->filename)._M_dataplus._M_p);
  if (iVar1 == 0) {
    iVar1 = strcmp((a->name)._M_dataplus._M_p,(b->name)._M_dataplus._M_p);
  }
  return SUB41((uint)iVar1 >> 0x1f,0);
}

Assistant:

bool operator()(const CommandLineFlagInfo& a,
                  const CommandLineFlagInfo& b) const {
    int cmp = strcmp(a.filename.c_str(), b.filename.c_str());
    if (cmp == 0)
      cmp = strcmp(a.name.c_str(), b.name.c_str());  // secondary sort key
    return cmp < 0;
  }